

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbirb.cpp
# Opt level: O0

RBBIDataHeader * __thiscall icu_63::RBBIRuleBuilder::build(RBBIRuleBuilder *this,UErrorCode *status)

{
  UBool UVar1;
  RBBITableBuilder *this_00;
  UErrorCode *size;
  RBBITableBuilder *local_58;
  RBBIDataHeader *data;
  UErrorCode *status_local;
  RBBIRuleBuilder *this_local;
  
  size = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    RBBIRuleScanner::parse(this->fScanner);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      RBBISetBuilder::buildRanges(this->fSetBuilder);
      this_00 = (RBBITableBuilder *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
      local_58 = (RBBITableBuilder *)0x0;
      if (this_00 != (RBBITableBuilder *)0x0) {
        RBBITableBuilder::RBBITableBuilder(this_00,this,&this->fForwardTree,status);
        local_58 = this_00;
      }
      this->fForwardTable = local_58;
      if (this->fForwardTable == (RBBITableBuilder *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        this_local = (RBBIRuleBuilder *)0x0;
      }
      else {
        RBBITableBuilder::buildForwardTable(this->fForwardTable);
        optimizeTables(this);
        RBBITableBuilder::buildSafeReverseTable(this->fForwardTable,status);
        RBBISetBuilder::buildTrie(this->fSetBuilder);
        this_local = (RBBIRuleBuilder *)flattenData(this);
        UVar1 = ::U_FAILURE(*status);
        if (UVar1 != '\0') {
          this_local = (RBBIRuleBuilder *)0x0;
        }
      }
    }
    else {
      this_local = (RBBIRuleBuilder *)0x0;
    }
  }
  else {
    this_local = (RBBIRuleBuilder *)0x0;
  }
  return (RBBIDataHeader *)this_local;
}

Assistant:

RBBIDataHeader *RBBIRuleBuilder::build(UErrorCode &status) {
    if (U_FAILURE(status)) {
        return nullptr;
    }

    fScanner->parse();
    if (U_FAILURE(status)) {
        return nullptr;
    }

    //
    // UnicodeSet processing.
    //    Munge the Unicode Sets to create a set of character categories.
    //    Generate the mapping tables (TRIE) from input code points to
    //    the character categories.
    //
    fSetBuilder->buildRanges();

    //
    //   Generate the DFA state transition table.
    //
    fForwardTable = new RBBITableBuilder(this, &fForwardTree, status);
    if (fForwardTable == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return nullptr;
    }

    fForwardTable->buildForwardTable();
    optimizeTables();
    fForwardTable->buildSafeReverseTable(status);


#ifdef RBBI_DEBUG
    if (fDebugEnv && uprv_strstr(fDebugEnv, "states")) {
        fForwardTable->printStates();
        fForwardTable->printRuleStatusTable();
        fForwardTable->printReverseTable();
    }
#endif

    fSetBuilder->buildTrie();

    //
    //   Package up the compiled data into a memory image
    //      in the run-time format.
    //
    RBBIDataHeader *data = flattenData(); // returns NULL if error
    if (U_FAILURE(status)) {
        return nullptr;
    }
    return data;
}